

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

bool __thiscall
GlobOpt::FinishOptPropOp
          (GlobOpt *this,Instr *instr,PropertySymOpnd *opnd,BasicBlock *block,
          bool updateExistingValue,bool *emitsTypeCheckOut,bool *changesTypeValueOut)

{
  code *pcVar1;
  BasicBlock *pBVar2;
  bool bVar3;
  BOOLEAN BVar4;
  BasicBlock *pBVar5;
  StackSym *pSVar6;
  JitArenaAllocator *pJVar7;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  undefined4 *puVar8;
  SymID local_94;
  TrackAllocData local_70;
  SymID local_48;
  bool local_43;
  bool local_42;
  undefined1 local_41;
  SymID opndId;
  bool isObjTypeChecked;
  bool isObjTypeSpecialized;
  bool isTypeCheckSeqCandidate;
  bool *emitsTypeCheckOut_local;
  BasicBlock *pBStack_30;
  bool updateExistingValue_local;
  BasicBlock *block_local;
  PropertySymOpnd *opnd_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  _opndId = emitsTypeCheckOut;
  emitsTypeCheckOut_local._7_1_ = updateExistingValue;
  pBStack_30 = block;
  block_local = (BasicBlock *)opnd;
  opnd_local = (PropertySymOpnd *)instr;
  instr_local = (Instr *)this;
  bVar3 = DoFieldRefOpts(this);
  if ((bVar3) &&
     (bVar3 = OpCodeAttr::FastFldInstr(*(OpCode *)&opnd_local->m_runtimePolymorphicInlineCache),
     bVar3)) {
    local_41 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate((PropertySymOpnd *)block_local);
    local_42 = false;
    local_43 = false;
    if ((bool)local_41) {
      local_42 = ProcessPropOpInTypeCheckSeq<true>
                           (this,(Instr *)opnd_local,(PropertySymOpnd *)block_local,pBStack_30,
                            (bool)(emitsTypeCheckOut_local._7_1_ & 1),_opndId,changesTypeValueOut,
                            &local_43);
    }
    pBVar2 = block_local;
    pBVar5 = (BasicBlock *)IR::Instr::GetDst((Instr *)opnd_local);
    if ((pBVar2 == pBVar5) && (this->objectTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0))
    {
      if (pBStack_30 == (BasicBlock *)0x0) {
        pBStack_30 = this->currentBlock;
      }
      bVar3 = IR::PropertySymOpnd::HasObjectTypeSym((PropertySymOpnd *)block_local);
      if (bVar3) {
        pSVar6 = IR::PropertySymOpnd::GetObjectTypeSym((PropertySymOpnd *)block_local);
        local_94 = (pSVar6->super_Sym).m_id;
      }
      else {
        local_94 = 0xffffffff;
      }
      local_48 = local_94;
      if (((local_42 & 1U) == 0) ||
         (bVar3 = IR::PropertySymOpnd::IsBeingAdded((PropertySymOpnd *)block_local), bVar3)) {
        if ((pBStack_30->globOptData).maybeWrittenTypeSyms ==
            (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          pJVar7 = this->alloc;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_70,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                     ,0x399);
          pJVar7 = (JitArenaAllocator *)
                   Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                   *)pJVar7,&local_70);
          this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                    new<Memory::JitArenaAllocator>(0x20,pJVar7,0x4e98c0);
          BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,this->alloc);
          (pBStack_30->globOptData).maybeWrittenTypeSyms = this_00;
        }
        if ((local_42 & 1U) != 0) {
          BVar4 = BVSparse<Memory::JitArenaAllocator>::Test(this->objectTypeSyms,local_48);
          if (BVar4 == '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x39f,"(this->objectTypeSyms->Test(opndId))",
                               "this->objectTypeSyms->Test(opndId)");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          BVSparse<Memory::JitArenaAllocator>::Clear(this->objectTypeSyms,local_48);
        }
        BVSparse<Memory::JitArenaAllocator>::Or
                  ((pBStack_30->globOptData).maybeWrittenTypeSyms,this->objectTypeSyms);
        if ((local_42 & 1U) != 0) {
          BVSparse<Memory::JitArenaAllocator>::Set(this->objectTypeSyms,local_48);
        }
      }
      if (((local_42 & 1U) == 0) ||
         (bVar3 = IR::PropertySymOpnd::ChangesObjectLayout((PropertySymOpnd *)block_local), bVar3))
      {
        KillObjectHeaderInlinedTypeSyms(this,pBStack_30,(bool)(local_42 & 1),local_48);
        KillAuxSlotPtrSyms(this,(PropertySymOpnd *)block_local,pBStack_30,(bool)(local_42 & 1));
      }
      else if (((local_43 & 1U) == 0) &&
              (bVar3 = HasLiveObjectHeaderInlinedTypeSym(this,pBStack_30,true,local_48), bVar3)) {
        IR::PropertySymOpnd::SetTypeCheckRequired((PropertySymOpnd *)block_local,true);
      }
    }
    this_local._7_1_ = (bool)(local_42 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::FinishOptPropOp(IR::Instr *instr, IR::PropertySymOpnd *opnd, BasicBlock* block, bool updateExistingValue, bool* emitsTypeCheckOut, bool* changesTypeValueOut)
{
    if (!DoFieldRefOpts() || !OpCodeAttr::FastFldInstr(instr->m_opcode))
    {
        return false;
    }

    bool isTypeCheckSeqCandidate = opnd->IsTypeCheckSeqCandidate();
    bool isObjTypeSpecialized = false;
    bool isObjTypeChecked = false;

    if (isTypeCheckSeqCandidate)
    {
        isObjTypeSpecialized = ProcessPropOpInTypeCheckSeq<true>(instr, opnd, block, updateExistingValue, emitsTypeCheckOut, changesTypeValueOut, &isObjTypeChecked);
    }

    if (opnd == instr->GetDst() && this->objectTypeSyms)
    {
        if (block == nullptr)
        {
            block = this->currentBlock;
        }

        // This is a property store that may change the layout of the object that it stores to. This means that
        // it may change any aliased object. Do two things to address this:
        // - Add all object types in this function to the set that may have had a property added. This will prevent
        //   final type optimization across this instruction. (Only needed here for non-specialized stores.)
        // - Kill all type symbols that currently hold object-header-inlined types. Any of them may have their layout
        //   changed by the addition of a property.

        SymID opndId = opnd->HasObjectTypeSym() ? opnd->GetObjectTypeSym()->m_id : -1;

        if (!isObjTypeSpecialized || opnd->IsBeingAdded())
        {
            if (block->globOptData.maybeWrittenTypeSyms == nullptr)
            {
                block->globOptData.maybeWrittenTypeSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
            }
            if (isObjTypeSpecialized)
            {
                // The current object will be protected by a type check, unless no further accesses to it are
                // protected by this access.
                Assert(this->objectTypeSyms->Test(opndId));
                this->objectTypeSyms->Clear(opndId);
            }
            block->globOptData.maybeWrittenTypeSyms->Or(this->objectTypeSyms);
            if (isObjTypeSpecialized)
            {
                this->objectTypeSyms->Set(opndId);
            }
        }

        if (!isObjTypeSpecialized || opnd->ChangesObjectLayout())
        {
            this->KillObjectHeaderInlinedTypeSyms(block, isObjTypeSpecialized, opndId);
            this->KillAuxSlotPtrSyms(opnd, block, isObjTypeSpecialized);
        }
        else if (!isObjTypeChecked && this->HasLiveObjectHeaderInlinedTypeSym(block, true, opndId))
        {
            opnd->SetTypeCheckRequired(true);
        }
    }

    return isObjTypeSpecialized;
}